

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

void __thiscall
spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId
          (InstructionDisassembler *this,spv_parsed_instruction_t *inst)

{
  uint16_t uVar1;
  mapped_type *pmVar2;
  byte bVar3;
  string local_1f8 [32];
  string local_1d8 [32];
  mapped_type *local_1b8;
  ostringstream *id_comment;
  char *pcStack_1a8;
  uint16_t i;
  char *separator;
  ostringstream local_198 [4];
  uint32_t id;
  ostringstream partial;
  Op opcode;
  spv_parsed_instruction_t *inst_local;
  InstructionDisassembler *this_local;
  
  if (this->comment_ == 0) {
    __assert_fail("comment_",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                  ,0x312,
                  "void spvtools::disassemble::InstructionDisassembler::GenerateCommentForDecoratedId(const spv_parsed_instruction_t &)"
                 );
  }
  uVar1 = inst->opcode;
  std::__cxx11::ostringstream::ostringstream(local_198);
  separator._4_4_ = 0;
  pcStack_1a8 = "";
  if (uVar1 == 0x47) {
    separator._4_4_ = inst->words[inst->operands->offset];
    for (id_comment._6_2_ = 1; id_comment._6_2_ < inst->num_operands;
        id_comment._6_2_ = id_comment._6_2_ + 1) {
      std::operator<<((ostream *)local_198,pcStack_1a8);
      pcStack_1a8 = " ";
      EmitOperand(this,(ostream *)local_198,inst,id_comment._6_2_);
    }
  }
  if (separator._4_4_ == 0) {
    id_comment._0_4_ = 1;
  }
  else {
    local_1b8 = std::
                unordered_map<unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->id_comments_,(key_type *)((long)&separator + 4));
    std::__cxx11::ostringstream::str();
    bVar3 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_1d8);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::operator<<((ostream *)local_1b8,", ");
    }
    pmVar2 = local_1b8;
    std::__cxx11::ostringstream::str();
    std::operator<<((ostream *)pmVar2,local_1f8);
    std::__cxx11::string::~string(local_1f8);
    id_comment._0_4_ = 0;
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void InstructionDisassembler::GenerateCommentForDecoratedId(
    const spv_parsed_instruction_t& inst) {
  assert(comment_);
  auto opcode = static_cast<spv::Op>(inst.opcode);

  std::ostringstream partial;
  uint32_t id = 0;
  const char* separator = "";

  switch (opcode) {
    case spv::Op::OpDecorate:
      // Take everything after `OpDecorate %id` and associate it with id.
      id = inst.words[inst.operands[0].offset];
      for (uint16_t i = 1; i < inst.num_operands; i++) {
        partial << separator;
        separator = " ";
        EmitOperand(partial, inst, i);
      }
      break;
    default:
      break;
  }

  if (id == 0) {
    return;
  }

  // Add the new comment to the comments of this id
  std::ostringstream& id_comment = id_comments_[id];
  if (!id_comment.str().empty()) {
    id_comment << ", ";
  }
  id_comment << partial.str();
}